

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O3

void apriltag_detector_remove_family(apriltag_detector_t *td,apriltag_family_t *fam)

{
  zarray_t *pzVar1;
  size_t __n;
  int iVar2;
  char *__s2;
  ulong uVar3;
  uint uVar4;
  apriltag_family_t *local_38;
  
  local_38 = fam;
  quick_decode_uninit(fam);
  pzVar1 = td->tag_families;
  if (pzVar1 == (zarray_t *)0x0) {
    __assert_fail("za != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                  ,0x127,"int zarray_remove_value(zarray_t *, const void *, int)");
  }
  uVar4 = pzVar1->size;
  if (0 < (int)uVar4) {
    __n = pzVar1->el_sz;
    __s2 = pzVar1->data;
    uVar3 = 0;
    do {
      iVar2 = bcmp(&local_38,__s2,__n);
      if (iVar2 == 0) {
        uVar3 = (uVar4 - 1) - uVar3;
        if (0 < (int)uVar3) {
          memmove(__s2,__s2 + __n,(uVar3 & 0xffffffff) * __n);
          uVar4 = pzVar1->size;
        }
        pzVar1->size = uVar4 - 1;
        return;
      }
      uVar3 = uVar3 + 1;
      __s2 = __s2 + __n;
    } while (uVar4 != uVar3);
  }
  return;
}

Assistant:

void apriltag_detector_remove_family(apriltag_detector_t *td, apriltag_family_t *fam)
{
    quick_decode_uninit(fam);
    zarray_remove_value(td->tag_families, &fam, 0);
}